

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

ByteCodeUsesInstr * __thiscall GlobOpt::ConvertToByteCodeUses(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeUsesInstr *this_00;
  PropertySym *local_28;
  PropertySym *propertySymUseBefore;
  
  local_28 = (PropertySym *)0x0;
  if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x4a1,"(this->byteCodeUses == nullptr)","this->byteCodeUses == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BVSparse<Memory::JitArenaAllocator>::ClearAll(this->byteCodeUsesBeforeOpt);
  TrackByteCodeSymUsed(instr,this->byteCodeUsesBeforeOpt,&local_28);
  CaptureByteCodeSymUses(this,instr);
  this_00 = InsertByteCodeUses(this,instr,true);
  IR::Instr::Remove(instr);
  if (this_00 != (ByteCodeUsesInstr *)0x0) {
    IR::ByteCodeUsesInstr::AggregateFollowingByteCodeUses(this_00);
  }
  return this_00;
}

Assistant:

IR::ByteCodeUsesInstr *
GlobOpt::ConvertToByteCodeUses(IR::Instr * instr)
{
#if DBG
    PropertySym *propertySymUseBefore = NULL;
    Assert(this->byteCodeUses == nullptr);
    this->byteCodeUsesBeforeOpt->ClearAll();
    GlobOpt::TrackByteCodeSymUsed(instr, this->byteCodeUsesBeforeOpt, &propertySymUseBefore);
#endif
    this->CaptureByteCodeSymUses(instr);
    IR::ByteCodeUsesInstr * byteCodeUsesInstr = this->InsertByteCodeUses(instr, true);
    instr->Remove();
    if (byteCodeUsesInstr)
    {
        byteCodeUsesInstr->AggregateFollowingByteCodeUses();
    }
    return byteCodeUsesInstr;
}